

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

StatusOr<double> __thiscall osqp::OsqpSolver::GetEpsAbs(OsqpSolver *this)

{
  StatusRep *in_RAX;
  long *in_RSI;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 aVar1;
  StatusOr<double> SVar2;
  string_view message;
  Status local_18;
  
  if (*in_RSI == 0) {
    message._M_str = (char *)0x1e;
    message._M_len = (size_t)&local_18;
    local_18.rep_ = (uintptr_t)in_RAX;
    absl::FailedPreconditionError(message);
    absl::internal_statusor::StatusOrData<double>::StatusOrData<absl::Status,_0>
              ((StatusOrData<double> *)this,&local_18);
    aVar1 = extraout_XMM0_Qa;
    if ((local_18.rep_ & 1) == 0) {
      absl::status_internal::StatusRep::Unref((StatusRep *)local_18.rep_);
      aVar1 = extraout_XMM0_Qa_00;
    }
  }
  else {
    aVar1 = *(anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 *)
             (*(long *)(*in_RSI + 0xb8) + 0x40);
    *(anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 *)(this + 1) = aVar1;
    (this->workspace_)._M_t.
    super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
    super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
    super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
         (OSQPWorkspaceHelper *)0x1;
  }
  SVar2.super_StatusOrData<double>.field_1 = aVar1;
  SVar2.super_StatusOrData<double>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<double>_1)this;
  return (StatusOr<double>)SVar2.super_StatusOrData<double>;
}

Assistant:

absl::StatusOr<double> OsqpSolver::GetEpsAbs() const {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  return workspace_->settings->eps_abs;
}